

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::SPxBoundFlippingRT<double>::flipAndUpdate(SPxBoundFlippingRT<double> *this,int *nflips)

{
  SSVectorBase<double> *this_00;
  SSVectorBase<double> *this_01;
  bool bVar1;
  int iVar2;
  pointer pBVar3;
  SVSetBase<double> *pSVar4;
  VectorBase<double> *pVVar5;
  int *piVar6;
  pointer pdVar7;
  pointer pdVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  SPxSolverBase<double> *pSVar12;
  Status *pSVar13;
  long lVar14;
  SPxOut *pSVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ostream *poVar19;
  long lVar20;
  long lVar21;
  Status SVar22;
  long in_FS_OFFSET;
  double dVar23;
  double dVar24;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity;
  int local_94;
  double local_90;
  double local_88;
  DataKey local_80;
  int *local_78;
  undefined4 local_6c;
  DataKey local_68;
  SSVectorBase<double> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  SSVectorBase<double> *local_38;
  
  this_00 = &this->updPrimRhs;
  SSVectorBase<double>::setup(this_00);
  SSVectorBase<double>::reDim
            (this_00,(((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                      thecovectors->set).thenum);
  this_01 = &this->updPrimVec;
  SSVectorBase<double>::reDim
            (this_01,(((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                      thecovectors->set).thenum);
  local_60 = this_00;
  SSVectorBase<double>::clear(this_00);
  SSVectorBase<double>::clear(this_01);
  iVar11 = *nflips;
  local_38 = this_01;
  if (iVar11 < 1) {
    local_94 = 0;
  }
  else {
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    lVar21 = 0;
    lVar20 = 0;
    local_94 = 0;
    local_78 = nflips;
    do {
      pBVar3 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = *(int *)((long)&pBVar3->idx + lVar21);
      lVar16 = (long)iVar11;
      if (lVar16 < 0) {
        local_94 = local_94 + 1;
      }
      else {
        pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        iVar2 = *(int *)((long)&pBVar3->src + lVar21);
        if (iVar2 == -1) {
          local_68 = (pSVar12->super_SPxBasisBase<double>).theBaseId.data[lVar16].super_DataKey;
          iVar2 = local_94;
          if (local_68.info < 0) {
            SPxRowId::SPxRowId((SPxRowId *)&local_80,(SPxId *)&local_68);
            iVar10 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                               (&(pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                 super_SVSetBase<double>.set,&local_80);
            pSVar13 = (pSVar12->super_SPxBasisBase<double>).thedesc.rowstat.data;
            lVar14 = (long)iVar10;
            SVar22 = pSVar13[lVar14];
            pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
            local_90 = (pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
            local_88 = (pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
            if (SVar22 == P_ON_LOWER) goto LAB_00219097;
            if (SVar22 == P_ON_UPPER) goto LAB_00218f91;
            pSVar15 = pSVar12->spxout;
            iVar2 = local_94 + 1;
            dVar24 = 0.0;
            if ((pSVar15 != (SPxOut *)0x0) && (dVar24 = 0.0, 0 < (int)pSVar15->m_verbosity)) {
              local_6c = 1;
              local_80.info = pSVar15->m_verbosity;
              (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_6c);
              pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                        spxout;
              poVar19 = pSVar15->m_streams[pSVar15->m_verbosity];
              lVar14 = 0x19;
              pcVar17 = "unexpected basis status: ";
              goto LAB_002196c8;
            }
          }
          else {
            SPxColId::SPxColId((SPxColId *)&local_80,(SPxId *)&local_68);
            iVar10 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                               (&(pSVar12->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                 super_SVSetBase<double>.set,&local_80);
            pSVar13 = (pSVar12->super_SPxBasisBase<double>).thedesc.colstat.data;
            lVar14 = (long)iVar10;
            SVar22 = pSVar13[lVar14];
            pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
            local_90 = (pSVar12->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
            local_88 = (pSVar12->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
            if (SVar22 == P_ON_LOWER) {
LAB_00219097:
              pSVar13[lVar14] = P_ON_UPPER;
              (pSVar12->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] =
                   -(pSVar12->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              dVar24 = local_88 - local_90;
              (((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->theUBbound)
              .val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] = local_48;
            }
            else if (SVar22 == P_ON_UPPER) {
LAB_00218f91:
              pSVar13[lVar14] = P_ON_LOWER;
              (pSVar12->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] =
                   -(pSVar12->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              (((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->theLBbound)
              .val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] = local_58;
              dVar24 = local_90 - local_88;
            }
            else {
              pSVar15 = pSVar12->spxout;
              iVar2 = local_94 + 1;
              dVar24 = 0.0;
              if ((pSVar15 != (SPxOut *)0x0) && (dVar24 = 0.0, 0 < (int)pSVar15->m_verbosity)) {
                local_6c = 1;
                local_80.info = pSVar15->m_verbosity;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_6c);
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                poVar19 = pSVar15->m_streams[pSVar15->m_verbosity];
                lVar14 = 0x18;
                pcVar17 = "FVEC unexpected status: ";
LAB_002196c8:
                local_94 = local_94 + 1;
                std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar17,lVar14);
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],SVar22)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar11)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," val: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->theFvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upd: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->theFvec->thedelta).super_VectorBase<double>.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," lower: ",8);
                std::ostream::_M_insert<double>(local_88);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upper: ",8);
                std::ostream::_M_insert<double>(local_90);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," bp.val: ",9);
                std::ostream::_M_insert<double>
                          (*(double *)
                            ((long)&((this->breakpoints).data.
                                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->val + lVar21));
                cVar9 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) +
                                cVar9);
                std::ostream::put(cVar9);
                std::ostream::flush();
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_80);
                dVar24 = 0.0;
                iVar2 = local_94;
              }
            }
          }
          local_94 = iVar2;
          piVar6 = (this->updPrimRhs).super_IdxSet.idx;
          iVar2 = (this->updPrimRhs).super_IdxSet.num;
          (this->updPrimRhs).super_IdxSet.num = iVar2 + 1;
          piVar6[iVar2] = iVar11;
          (this->updPrimRhs).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar16] = dVar24;
          nflips = local_78;
        }
        else {
          if (iVar2 == 1) {
            pSVar13 = ((pSVar12->super_SPxBasisBase<double>).thedesc.costat)->data;
            SVar22 = pSVar13[lVar16];
            dVar24 = (pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            dVar23 = (pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            if (SVar22 == P_ON_LOWER) {
              pSVar13[lVar16] = P_ON_UPPER;
              (pSVar12->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16] =
                   -(pSVar12->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              dVar23 = dVar24 - dVar23;
              pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar12->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16] = local_48;
              local_90 = (pSVar12->theCoLbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16] * dVar23;
            }
            else if (SVar22 == P_ON_UPPER) {
              pSVar13[lVar16] = P_ON_LOWER;
              (pSVar12->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16] =
                   -(pSVar12->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              dVar23 = dVar23 - dVar24;
              pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar12->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar16] = local_58;
              local_90 = (pSVar12->theCoUbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16] * dVar23;
            }
            else {
              local_94 = local_94 + 1;
              pSVar15 = pSVar12->spxout;
              if ((pSVar15 != (SPxOut *)0x0) && (0 < (int)pSVar15->m_verbosity)) {
                local_68.info = pSVar15->m_verbosity;
                local_80.info = WARNING;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_80);
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity],"COPVEC unexpected status: ",
                           0x1a);
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],SVar22)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar11)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," val: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->theCoPvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upd: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->theCoPvec->thedelta).super_VectorBase<double>.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," lower: ",8);
                std::ostream::_M_insert<double>(dVar23);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upper: ",8);
                std::ostream::_M_insert<double>(dVar24);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," bp.val: ",9);
                std::ostream::_M_insert<double>
                          (*(double *)
                            ((long)&((this->breakpoints).data.
                                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->val + lVar21));
                cVar9 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) +
                                cVar9);
                std::ostream::put(cVar9);
                std::ostream::flush();
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_68);
              }
              dVar23 = 0.0;
              local_90 = 0.0;
            }
            SSVectorBase<double>::setValue
                      (local_60,iVar11,
                       (this->updPrimRhs).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar16] - dVar23);
          }
          else {
            if (iVar2 != 0) goto LAB_002198a3;
            pSVar13 = ((pSVar12->super_SPxBasisBase<double>).thedesc.stat)->data;
            SVar22 = pSVar13[lVar16];
            dVar24 = (pSVar12->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            dVar23 = (pSVar12->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16];
            if (SVar22 == P_ON_LOWER) {
              pSVar13[lVar16] = P_ON_UPPER;
              (pSVar12->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] =
                   (pSVar12->theLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              dVar23 = dVar24 - dVar23;
              pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar12->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] = local_58;
              local_90 = (pSVar12->theUbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16] * dVar23;
            }
            else if (SVar22 == P_ON_UPPER) {
              pSVar13[lVar16] = P_ON_LOWER;
              (pSVar12->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] =
                   (pSVar12->theUbound->val).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar16];
              ::soplex::infinity::__tls_init();
              dVar23 = dVar23 - dVar24;
              pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              (pSVar12->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] = local_48;
              local_90 = (pSVar12->theLbound->val).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16] * dVar23;
            }
            else {
              local_94 = local_94 + 1;
              pSVar15 = pSVar12->spxout;
              if ((pSVar15 != (SPxOut *)0x0) && (0 < (int)pSVar15->m_verbosity)) {
                local_68.info = pSVar15->m_verbosity;
                local_80.info = WARNING;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_80);
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity],"PVEC unexpected status: ",0x18)
                ;
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],SVar22)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," index: ",8);
                std::ostream::operator<<((ostream *)pSVar15->m_streams[pSVar15->m_verbosity],iVar11)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," val: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->thePvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upd: ",6);
                std::ostream::_M_insert<double>
                          ((((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
                            ->thePvec->thedelta).super_VectorBase<double>.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar16]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," lower: ",8);
                std::ostream::_M_insert<double>(dVar23);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," upper: ",8);
                std::ostream::_M_insert<double>(dVar24);
                std::__ostream_insert<char,std::char_traits<char>>
                          (pSVar15->m_streams[pSVar15->m_verbosity]," bp.val: ",9);
                std::ostream::_M_insert<double>
                          (*(double *)
                            ((long)&((this->breakpoints).data.
                                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->val + lVar21));
                cVar9 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
                std::ios::widen((char)*(undefined8 *)
                                       (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) +
                                cVar9);
                std::ostream::put(cVar9);
                std::ostream::flush();
                pSVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                          spxout;
                (*pSVar15->_vptr_SPxOut[2])(pSVar15,&local_68);
              }
              dVar23 = 0.0;
              local_90 = 0.0;
            }
            pSVar4 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     thevectors;
            SSVectorBase<double>::multAdd<double,double>
                      (local_60,dVar23,
                       (SVectorBase<double> *)
                       ((pSVar4->set).theitem + (pSVar4->set).thekey[lVar16].idx));
          }
          nflips = local_78;
          if (((local_90 != 0.0) || (NAN(local_90))) &&
             (pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,
             pSVar12->m_nonbasicValueUpToDate == true)) {
            pSVar12->m_nonbasicValue = local_90 + pSVar12->m_nonbasicValue;
            SPxSolverBase<double>::nonbasicValue(pSVar12);
            nflips = local_78;
          }
        }
      }
LAB_002198a3:
      lVar20 = lVar20 + 1;
      iVar11 = *nflips;
      lVar21 = lVar21 + 0x10;
    } while (lVar20 < iVar11);
  }
  *nflips = iVar11 - local_94;
  if (iVar11 - local_94 != 0 && local_94 <= iVar11) {
    pSVar12 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    bVar1 = (this->updPrimRhs).setupStatus;
    if (pSVar12->theRep == ROW) {
      pVVar5 = pSVar12->theCoPrhs;
      if (bVar1 == false) {
        pdVar7 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar20 = 0x3d8;
        lVar21 = 0x3d0;
        uVar18 = (uint)((ulong)((long)(pVVar5->val).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7) >> 3);
        if (0 < (int)uVar18) {
          pdVar8 = (this->updPrimRhs).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (ulong)(uVar18 & 0x7fffffff) + 1;
          do {
            pdVar7[lVar16 + -2] = pdVar7[lVar16 + -2] - pdVar8[lVar16 + -2];
            lVar16 = lVar16 + -1;
          } while (1 < lVar16);
        }
      }
      else {
        lVar16 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar20 = 0x3d8;
        lVar21 = 0x3d0;
        if (0 < lVar16) {
          piVar6 = (this->updPrimRhs).super_IdxSet.idx;
          pdVar7 = (this->updPrimRhs).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 1;
          do {
            iVar11 = piVar6[lVar16 + -2];
            pdVar8[iVar11] = pdVar8[iVar11] - pdVar7[iVar11];
            lVar16 = lVar16 + -1;
          } while (1 < lVar16);
        }
      }
    }
    else {
      pVVar5 = pSVar12->theFrhs;
      if (bVar1 == false) {
        pdVar7 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar20 = 0x3b8;
        lVar21 = 0x3b0;
        uVar18 = (uint)((ulong)((long)(pVVar5->val).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7) >> 3);
        if (0 < (int)uVar18) {
          pdVar8 = (this->updPrimRhs).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (ulong)(uVar18 & 0x7fffffff) + 1;
          do {
            pdVar7[lVar16 + -2] = pdVar7[lVar16 + -2] - pdVar8[lVar16 + -2];
            lVar16 = lVar16 + -1;
          } while (1 < lVar16);
        }
      }
      else {
        lVar16 = (long)(this->updPrimRhs).super_IdxSet.num;
        lVar20 = 0x3b8;
        lVar21 = 0x3b0;
        if (0 < lVar16) {
          piVar6 = (this->updPrimRhs).super_IdxSet.idx;
          pdVar7 = (this->updPrimRhs).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 1;
          do {
            iVar11 = piVar6[lVar16 + -2];
            pdVar8[iVar11] = pdVar8[iVar11] - pdVar7[iVar11];
            lVar16 = lVar16 + -1;
          } while (1 < lVar16);
        }
      }
    }
    *(SSVectorBase<double> **)
     ((long)&(pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar21) = local_38;
    *(SSVectorBase<double> **)
     ((long)&(pSVar12->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray + lVar20) = local_60;
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}